

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can_implicitly_cast.cpp
# Opt level: O2

void duckdb::CanCastImplicitlyFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool value;
  ClientContext *context;
  reference pvVar1;
  reference pvVar2;
  Value v;
  
  context = ExpressionState::GetContext(state);
  pvVar1 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  value = CanCastImplicitly(context,&pvVar1->type,&pvVar2->type);
  Value::BOOLEAN(&v,value);
  Vector::Reference(result,&v);
  Value::~Value(&v);
  return;
}

Assistant:

static void CanCastImplicitlyFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &context = state.GetContext();
	bool can_cast_implicitly = CanCastImplicitly(context, args.data[0].GetType(), args.data[1].GetType());
	auto v = Value::BOOLEAN(can_cast_implicitly);
	result.Reference(v);
}